

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

string * helics::fedStateString_abi_cxx11_(FederateStates state)

{
  int iVar1;
  string *psVar2;
  
  if (fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::
                                 created_abi_cxx11_);
    if (iVar1 != 0) {
      fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_._M_dataplus._M_p =
           (pointer)&fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_,
                 "created","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::
                                 estate_abi_cxx11_);
    if (iVar1 != 0) {
      fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_._M_dataplus._M_p =
           (pointer)&fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_,
                 "error","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_._M_dataplus._M_p =
           (pointer)&fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_,
                 "initializing","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_);
    if (iVar1 != 0) {
      fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_._M_dataplus._M_p =
           (pointer)&fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_,
                 "disconnected","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_._M_dataplus._M_p =
           (pointer)&fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_,
                 "executing","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_._M_dataplus._M_p =
           (pointer)&fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_,
                 "terminating","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_);
    if (iVar1 != 0) {
      fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_._M_dataplus._M_p =
           (pointer)&fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_,
                 "unknown","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_);
    }
  }
  if (state < UNKNOWN) {
    psVar2 = (string *)(&PTR_created_abi_cxx11__00563ac0)[state];
  }
  else {
    psVar2 = &fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

const std::string& fedStateString(FederateStates state)
{
    static const std::string created{"created"};
    static const std::string estate{"error"};
    static const std::string init{"initializing"};
    static const std::string dis{"disconnected"};
    static const std::string exec{"executing"};
    static const std::string term{"terminating"};
    static const std::string unk{"unknown"};

    switch (state) {
        case FederateStates::CREATED:
            return created;
        case FederateStates::INITIALIZING:
            return init;
        case FederateStates::EXECUTING:
            return exec;
        case FederateStates::TERMINATING:
            return term;
        case FederateStates::FINISHED:
            return dis;
        case FederateStates::ERRORED:
            return estate;
        case FederateStates::UNKNOWN:
        default:
            return unk;
    }
}